

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_arena_unittest::NestedMessage::_InternalSerialize
          (NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int32_t value;
  uint32_t *puVar2;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  NestedMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  NestedMessage *this_local;
  
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar2 & 1) != 0) {
    value = _internal_d(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value,target);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_arena_unittest.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 d = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_d(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_arena_unittest.NestedMessage)
  return target;
}